

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

void lj_func_free(global_State *g,GCfunc *fn)

{
  size_t local_40;
  MSize size;
  GCfunc *fn_local;
  global_State *g_local;
  
  if ((fn->c).ffid == '\0') {
    local_40 = (ulong)(fn->c).nupvalues * 8 + 0x28;
  }
  else {
    local_40 = (ulong)(fn->c).nupvalues * 8 + 0x30;
  }
  (g->gc).total = (g->gc).total - local_40;
  (*g->allocf)(g->allocd,fn,local_40,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_func_free(global_State *g, GCfunc *fn)
{
  MSize size = isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			       sizeCfunc((MSize)fn->c.nupvalues);
  lj_mem_free(g, fn, size);
}